

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  uint16_t *puVar4;
  int iVar5;
  _Bool _Var6;
  int32_t iVar7;
  int iVar8;
  ulong uVar9;
  array_container_t *paVar10;
  undefined4 extraout_var;
  array_container_t *paVar11;
  uint uVar12;
  array_container_t *paVar13;
  uint8_t uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  byte type2;
  array_container_t *src_1;
  ushort uVar19;
  ulong uVar20;
  int iVar21;
  uint8_t result_type;
  uint8_t local_6b;
  ushort local_6a;
  array_container_t *local_68;
  int local_5c;
  ulong local_58;
  array_container_t *local_50;
  roaring_bitmap_t *local_48;
  ulong local_40;
  ulong local_38;
  
  if (x1 != x2) {
    iVar3 = (x1->high_low_container).size;
    iVar8 = (x2->high_low_container).size;
    uVar20 = 0;
    uVar9 = 0;
    if (0 < iVar8 && 0 < iVar3) {
      uVar9 = 0;
      uVar18 = 0;
      uVar20 = 0;
      local_5c = iVar8;
      local_48 = x2;
      do {
        uVar12 = (uint)uVar9 & 0xffff;
        uVar2 = (x1->high_low_container).keys[uVar12];
        puVar4 = (x2->high_low_container).keys;
        uVar17 = (uint)uVar18;
        uVar15 = uVar17 & 0xffff;
        uVar19 = puVar4[uVar15];
        if (uVar2 != uVar19) {
          if (uVar2 < uVar19) {
            iVar7 = ra_advance_until_freeing(&x1->high_low_container,uVar19,(uint)uVar9);
            uVar9 = CONCAT44(extraout_var,iVar7);
          }
          else {
            uVar12 = (x2->high_low_container).size;
            uVar15 = uVar17 + 1;
            if (((int)uVar15 < (int)uVar12) && (puVar4[(int)uVar15] < uVar2)) {
              uVar17 = uVar17 + 2;
              iVar21 = 1;
              if ((int)uVar17 < (int)uVar12) {
                iVar21 = 1;
                do {
                  uVar18 = (ulong)uVar17;
                  uVar19 = puVar4[(int)uVar17];
                  if (uVar2 <= uVar19) goto LAB_00116479;
                  iVar5 = iVar21 * 2;
                  uVar17 = uVar15 + iVar21 * 2;
                  iVar21 = iVar5;
                } while ((int)uVar17 < (int)uVar12);
              }
              uVar19 = puVar4[(long)(int)uVar12 + -1];
              uVar18 = (long)(int)uVar12 - 1;
LAB_00116479:
              if (uVar19 != uVar2) {
                if (uVar19 < uVar2) {
                  uVar18 = (ulong)uVar12;
                }
                else if ((iVar21 >> 1) + uVar15 + 1 != (int)uVar18) {
                  uVar15 = (iVar21 >> 1) + uVar15;
                  do {
                    uVar17 = (int)(uVar15 + (int)uVar18) >> 1;
                    if (puVar4[(int)uVar17] == uVar2) {
                      uVar18 = (ulong)uVar17;
                      break;
                    }
                    if (uVar2 <= puVar4[(int)uVar17]) {
                      uVar18 = (ulong)uVar17;
                      uVar17 = uVar15;
                    }
                    uVar15 = uVar17;
                  } while (uVar15 + 1 != (int)uVar18);
                }
              }
            }
            else {
              uVar18 = (ulong)uVar15;
            }
          }
          goto LAB_001164ab;
        }
        bVar1 = (x1->high_low_container).typecodes[uVar12];
        local_40 = (ulong)bVar1;
        paVar13 = (array_container_t *)(x1->high_low_container).containers[uVar12];
        type2 = (x2->high_low_container).typecodes[uVar15];
        src_1 = (array_container_t *)(x2->high_low_container).containers[uVar15];
        local_6a = uVar2;
        local_58 = uVar9;
        local_38 = uVar20;
        if (bVar1 == 4) {
          paVar10 = (array_container_t *)container_and(paVar13,'\x04',src_1,type2,&local_6b);
          goto LAB_00116302;
        }
        local_50 = paVar13;
        if (type2 == 4) {
          type2 = *(byte *)&src_1->array;
          if (type2 == 4) goto LAB_00116664;
          src_1 = *(array_container_t **)src_1;
        }
        local_68 = (array_container_t *)0x0;
        paVar10 = paVar13;
        switch((uint)type2 + (uint)bVar1 * 4) {
        case 5:
          _Var6 = bitset_bitset_container_intersection_inplace
                            ((bitset_container_t *)paVar13,(bitset_container_t *)src_1,&local_68);
          goto LAB_001165da;
        case 6:
          paVar10 = (array_container_t *)calloc(1,0x10);
          array_bitset_container_intersection(src_1,(bitset_container_t *)paVar13,paVar10);
          local_6b = '\x02';
          break;
        case 7:
          _Var6 = run_bitset_container_intersection
                            ((run_container_t *)src_1,(bitset_container_t *)paVar13,&local_50);
          local_6b = '\x02' - _Var6;
          paVar10 = local_50;
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1400,
                        "container_t *container_iand(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                       );
        case 9:
          local_6b = '\x02';
          array_bitset_container_intersection(paVar13,(bitset_container_t *)src_1,paVar13);
          break;
        case 10:
          array_container_intersection_inplace(paVar13,src_1);
          local_6b = '\x02';
          break;
        case 0xb:
          paVar10 = (array_container_t *)calloc(1,0x10);
          paVar11 = src_1;
          src_1 = paVar13;
          goto LAB_00116578;
        case 0xd:
          _Var6 = run_bitset_container_intersection
                            ((run_container_t *)paVar13,(bitset_container_t *)src_1,&local_68);
LAB_001165da:
          local_6b = '\x02' - _Var6;
          paVar10 = local_68;
          break;
        case 0xe:
          paVar10 = (array_container_t *)calloc(1,0x10);
          paVar11 = paVar13;
LAB_00116578:
          local_6b = '\x02';
          array_run_container_intersection(src_1,(run_container_t *)paVar11,paVar10);
          break;
        case 0xf:
          paVar11 = (array_container_t *)calloc(1,0x10);
          run_container_intersection
                    ((run_container_t *)paVar13,(run_container_t *)src_1,(run_container_t *)paVar11)
          ;
          paVar10 = (array_container_t *)
                    convert_run_to_efficient_container((run_container_t *)paVar11,&local_6b);
          if (paVar10 != paVar11) {
            run_container_free((run_container_t *)paVar11);
          }
        }
LAB_00116302:
        if (paVar10 != paVar13) {
          container_free(paVar13,(uint8_t)local_40);
        }
        uVar20 = local_38;
        paVar13 = paVar10;
        uVar14 = local_6b;
        if (local_6b == '\x04') {
          uVar14 = *(uint8_t *)&paVar10->array;
          if (uVar14 == '\x04') {
LAB_00116664:
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          paVar13 = *(array_container_t **)paVar10;
        }
        if ((uVar14 == '\x03') || (uVar14 == '\x02')) {
          if (paVar13->cardinality < 1) goto LAB_00116489;
LAB_001163a0:
          iVar8 = (int)local_38;
          if ((x1->high_low_container).size <= iVar8) {
            __assert_fail("i < ra->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1a55,
                          "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                         );
          }
          (x1->high_low_container).keys[iVar8] = local_6a;
          (x1->high_low_container).containers[iVar8] = paVar10;
          (x1->high_low_container).typecodes[iVar8] = local_6b;
          uVar20 = (ulong)(iVar8 + 1);
        }
        else {
          if (uVar14 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x11c6,
                          "_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
          }
          if (paVar13->cardinality != 0) {
            if (paVar13->cardinality != -1) goto LAB_001163a0;
            lVar16 = 0;
            do {
              if (*(long *)(paVar13->array + lVar16 * 4) != 0) goto LAB_001163a0;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x400);
          }
LAB_00116489:
          container_free(paVar10,local_6b);
        }
        uVar9 = (ulong)((int)local_58 + 1);
        uVar18 = (ulong)(uVar17 + 1);
        x2 = local_48;
        iVar8 = local_5c;
LAB_001164ab:
      } while (((int)uVar9 < iVar3) && ((int)uVar18 < iVar8));
    }
    iVar8 = (int)uVar9;
    iVar21 = iVar3 - iVar8;
    if (iVar21 != 0 && iVar8 <= iVar3) {
      lVar16 = (long)iVar8;
      do {
        container_free((x1->high_low_container).containers[lVar16],
                       (x1->high_low_container).typecodes[lVar16]);
        lVar16 = lVar16 + 1;
        iVar21 = iVar21 + -1;
      } while (iVar21 != 0);
    }
    if ((x1->high_low_container).size < (int)uVar20) {
      __assert_fail("new_length <= ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x47af,"void ra_downsize(roaring_array_t *, int32_t)");
    }
    (x1->high_low_container).size = (int)uVar20;
  }
  return;
}

Assistant:

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    if (x1 == x2) return;
    int pos1 = 0, pos2 = 0, intersection_size = 0;
    const int length1 = ra_get_size(&x1->high_low_container);
    const int length2 = ra_get_size(&x2->high_low_container);

    // any skipped-over or newly emptied containers in x1
    // have to be freed.
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2, result_type;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.
            container_t *c =
                (type1 == SHARED_CONTAINER_TYPE)
                    ? container_and(c1, type1, c2, type2, &result_type)
                    : container_iand(c1, type1, c2, type2, &result_type);

            if (c != c1) {  // in this instance a new container was created, and
                            // we need to free the old one
                container_free(c1, type1);
            }
            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c,
                                                      result_type);
                intersection_size++;
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {
            pos1 = ra_advance_until_freeing(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }

    // if we ended early because x2 ran out, then all remaining in x1 should be
    // freed
    while (pos1 < length1) {
        container_free(x1->high_low_container.containers[pos1],
                       x1->high_low_container.typecodes[pos1]);
        ++pos1;
    }

    // all containers after this have either been copied or freed
    ra_downsize(&x1->high_low_container, intersection_size);
}